

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_add_printf_Test::Buffer_add_printf_Test(Buffer_add_printf_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00179b68;
  return;
}

Assistant:

TEST(Buffer, add_printf) {
    BufferWithLocalArray<64> local;

    // printf into the buffer
    auto constexpr expected = std::string_view { "Hello, World!" };
    EXPECT_EQ(0, bfy_buffer_add_printf(&local.buf, "%s, %s!", "Hello", "World"));
    EXPECT_EQ(1, buffer_count_pages(&local.buf));

    // confirm that the string was written into the memory used by the buffer
    EXPECT_EQ(std::size(expected), bfy_buffer_get_content_len(&local.buf));
    EXPECT_EQ(std::size(local.array) - std::size(expected), bfy_buffer_get_space_len(&local.buf));
    EXPECT_EQ(expected, std::data(local.array));
}